

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O1

ssize_t __thiscall UniValue::write_abi_cxx11_(UniValue *this,int __fd,void *__buf,size_t __n)

{
  long *plVar1;
  long *plVar2;
  uint indentLevel;
  undefined4 in_register_00000034;
  UniValue *this_00;
  long *local_90;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  this_00 = (UniValue *)CONCAT44(in_register_00000034,__fd);
  *(size_type **)this = &(this->val)._M_string_length;
  (this->val)._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&(this->val)._M_string_length = 0;
  std::__cxx11::string::reserve((ulong)this);
  indentLevel = (int)__n + (uint)((int)__n == 0);
  switch(this_00->typ) {
  case VNULL:
    goto LAB_001092f6;
  case VOBJ:
    writeObject(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VARR:
    writeArray(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VSTR:
    json_escape(&local_50,&this_00->val);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x10a3ee);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*plVar1;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    break;
  case VNUM:
    std::__cxx11::string::_M_append((char *)this,(ulong)(this_00->val)._M_dataplus._M_p);
    break;
  case VBOOL:
    std::__cxx11::string::compare((char *)&this_00->val);
LAB_001092f6:
    std::__cxx11::string::append((char *)this);
  }
  return (ssize_t)this;
}

Assistant:

std::string UniValue::write(unsigned int prettyIndent,
                            unsigned int indentLevel) const
{
    std::string s;
    s.reserve(1024);

    unsigned int modIndent = indentLevel;
    if (modIndent == 0)
        modIndent = 1;

    switch (typ) {
    case VNULL:
        s += "null";
        break;
    case VOBJ:
        writeObject(prettyIndent, modIndent, s);
        break;
    case VARR:
        writeArray(prettyIndent, modIndent, s);
        break;
    case VSTR:
        s += "\"" + json_escape(val) + "\"";
        break;
    case VNUM:
        s += val;
        break;
    case VBOOL:
        s += (val == "1" ? "true" : "false");
        break;
    }

    return s;
}